

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
           *this,type_index *p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  pair<std::type_index_&&,_std::shared_ptr<slang::DiagArgFormatter>_&&> local_38;
  locator local_28;
  
  *num_destroyed = *num_destroyed + 1;
  local_38.second = (shared_ptr<slang::DiagArgFormatter> *)(p + 1);
  local_38.first = p;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
  ::
  nosize_unchecked_emplace_at<std::pair<std::type_index&&,std::shared_ptr<slang::DiagArgFormatter>&&>>
            (&local_28,
             (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_38);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p[2]._M_target !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p[2]._M_target);
  }
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }